

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_data_source_get_loop_point_in_pcm_frames
               (ma_data_source *pDataSource,ma_uint64 *pLoopBegInFrames,ma_uint64 *pLoopEndInFrames)

{
  if (pLoopBegInFrames != (ma_uint64 *)0x0) {
    *pLoopBegInFrames = 0;
  }
  if (pLoopEndInFrames != (ma_uint64 *)0x0) {
    *pLoopEndInFrames = 0;
  }
  if (pDataSource != (ma_data_source *)0x0) {
    if (pLoopBegInFrames != (ma_uint64 *)0x0) {
      *pLoopBegInFrames = *(ma_uint64 *)((long)pDataSource + 0x18);
    }
    if (pLoopEndInFrames != (ma_uint64 *)0x0) {
      *pLoopEndInFrames = *(ma_uint64 *)((long)pDataSource + 0x20);
    }
  }
  return;
}

Assistant:

MA_API void ma_data_source_get_loop_point_in_pcm_frames(const ma_data_source* pDataSource, ma_uint64* pLoopBegInFrames, ma_uint64* pLoopEndInFrames)
{
    const ma_data_source_base* pDataSourceBase = (const ma_data_source_base*)pDataSource;

    if (pLoopBegInFrames != NULL) {
        *pLoopBegInFrames = 0;
    }
    if (pLoopEndInFrames != NULL) {
        *pLoopEndInFrames = 0;
    }

    if (pDataSource == NULL) {
        return;
    }

    if (pLoopBegInFrames != NULL) {
        *pLoopBegInFrames = pDataSourceBase->loopBegInFrames;
    }

    if (pLoopEndInFrames != NULL) {
        *pLoopEndInFrames = pDataSourceBase->loopEndInFrames;
    }
}